

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubeb_log.cpp
# Opt level: O3

void __thiscall cubeb_async_logger::stop(cubeb_async_logger *this)

{
  __pointer_type prVar1;
  _Head_base<0UL,_cubeb_log_message_*,_false> _Var2;
  __pointer_type prVar3;
  __pointer_type prVar4;
  bool bVar5;
  
  LOCK();
  (this->shutdown_thread)._M_base._M_i = true;
  UNLOCK();
  if ((this->logging_thread)._M_id._M_thread != 0) {
    std::thread::join();
    if ((this->logging_thread)._M_id._M_thread != 0) {
      std::terminate();
    }
    prVar1 = (this->msg_queue)._M_b._M_p;
    LOCK();
    prVar3 = (this->msg_queue)._M_b._M_p;
    bVar5 = prVar1 == prVar3;
    if (bVar5) {
      (this->msg_queue)._M_b._M_p = (__pointer_type)0x0;
      prVar3 = prVar1;
    }
    UNLOCK();
    while (!bVar5) {
      LOCK();
      prVar4 = (this->msg_queue)._M_b._M_p;
      bVar5 = prVar3 == prVar4;
      if (bVar5) {
        (this->msg_queue)._M_b._M_p = (__pointer_type)0x0;
        prVar4 = prVar3;
      }
      UNLOCK();
      prVar1 = prVar3;
      prVar3 = prVar4;
    }
    if ((prVar1 != (__pointer_type)0x0) &&
       (_Var2._M_head_impl =
             (prVar1->data_)._M_t.
             super___uniq_ptr_impl<cubeb_log_message,_std::default_delete<cubeb_log_message[]>_>.
             _M_t.
             super__Tuple_impl<0UL,_cubeb_log_message_*,_std::default_delete<cubeb_log_message[]>_>.
             super__Head_base<0UL,_cubeb_log_message_*,_false>._M_head_impl,
       _Var2._M_head_impl != (cubeb_log_message *)0x0)) {
      operator_delete__(_Var2._M_head_impl);
    }
    operator_delete(prVar1,0x18);
    LOCK();
    (this->msg_queue_consumer)._M_b._M_p = (__pointer_type)0x0;
    UNLOCK();
  }
  return;
}

Assistant:

void stop()
  {
    assert(((g_cubeb_log_callback == cubeb_noop_log_callback) ||
            !g_cubeb_log_callback) &&
           "Only call stop after logging has been disabled.");
    shutdown_thread = true;
    if (logging_thread.get_id() != std::thread::id()) {
      logging_thread.join();
      logging_thread = std::thread();
      auto * owned_queue = msg_queue.load();
      // Check if the queue is being used. If not, grab ownership. If yes,
      // try again shortly. At this point, the logging thread has been joined,
      // so nothing is going to dequeue.
      // If there is a valid pointer here, then the real-time audio thread that
      // logs won't attempt to write into the queue, and instead drop the
      // message.
      while (!msg_queue.compare_exchange_weak(owned_queue, nullptr)) {
      }
      delete owned_queue;
      msg_queue_consumer.store(nullptr);
    }
  }